

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_step1(Curl_cfilter *cf,Curl_easy *data)

{
  ssl_peer *peer;
  CURLcode CVar1;
  BIO_METHOD *pBVar2;
  BIO *pBVar3;
  CURLcode result;
  BIO *bio;
  alpn_proto_buf proto;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  peer = (ssl_peer *)cf->ctx;
  proto._32_8_ = peer[1].dispname;
  memset(&bio,0,0x28);
  if ((peer[1].hostname == (char *)0x0) ||
     (CVar1 = Curl_alpn_to_proto_buf((alpn_proto_buf *)&bio,(alpn_spec *)peer[1].hostname),
     CVar1 == CURLE_OK)) {
    cf_local._4_4_ =
         Curl_ossl_ctx_init((ossl_ctx *)proto._32_8_,cf,data,peer,3,(uchar *)&bio,
                            (long)(int)proto.data._28_4_,(Curl_ossl_ctx_setup_cb *)0x0,(void *)0x0,
                            ossl_new_session_cb,cf);
    if (cf_local._4_4_ == CURLE_OK) {
      pBVar2 = ossl_bio_cf_method_create();
      *(BIO_METHOD **)(proto._32_8_ + 0x18) = pBVar2;
      if (*(long *)(proto._32_8_ + 0x18) == 0) {
        cf_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        pBVar3 = BIO_new(*(BIO_METHOD **)(proto._32_8_ + 0x18));
        if (pBVar3 == (BIO *)0x0) {
          cf_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          BIO_set_data(pBVar3,cf);
          BIO_up_ref(pBVar3);
          SSL_set0_rbio(*(undefined8 *)(proto._32_8_ + 8),pBVar3);
          SSL_set0_wbio(*(undefined8 *)(proto._32_8_ + 8),pBVar3);
          if ((((peer[1].hostname != (char *)0x0) &&
               (Curl_alpn_to_proto_str((alpn_proto_buf *)&bio,(alpn_spec *)peer[1].hostname),
               data != (Curl_easy *)0x0)) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) {
            Curl_infof(data,"ALPN: curl offers %s",&bio);
          }
          *(undefined4 *)((long)&peer[4].dispname + 4) = 1;
          cf_local._4_4_ = CURLE_OK;
        }
      }
    }
  }
  else {
    Curl_failf(data,"Error determining ALPN");
    cf_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode ossl_connect_step1(struct Curl_cfilter *cf,
                                   struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  struct alpn_proto_buf proto;
  BIO *bio;
  CURLcode result;

  DEBUGASSERT(ssl_connect_1 == connssl->connecting_state);
  DEBUGASSERT(octx);
  memset(&proto, 0, sizeof(proto));
#ifdef HAS_ALPN
  if(connssl->alpn) {
    result = Curl_alpn_to_proto_buf(&proto, connssl->alpn);
    if(result) {
      failf(data, "Error determining ALPN");
      return CURLE_SSL_CONNECT_ERROR;
    }
  }
#endif

  result = Curl_ossl_ctx_init(octx, cf, data, &connssl->peer, TRNSPRT_TCP,
                              proto.data, proto.len, NULL, NULL,
                              ossl_new_session_cb, cf);
  if(result)
    return result;

  octx->bio_method = ossl_bio_cf_method_create();
  if(!octx->bio_method)
    return CURLE_OUT_OF_MEMORY;
  bio = BIO_new(octx->bio_method);
  if(!bio)
    return CURLE_OUT_OF_MEMORY;

  BIO_set_data(bio, cf);
#ifdef HAVE_SSL_SET0_WBIO
  /* with OpenSSL v1.1.1 we get an alternative to SSL_set_bio() that works
   * without backward compat quirks. Every call takes one reference, so we
   * up it and pass. SSL* then owns it and will free.
   * We check on the function in configure, since LibreSSL and friends
   * each have their own versions to add support for this. */
  BIO_up_ref(bio);
  SSL_set0_rbio(octx->ssl, bio);
  SSL_set0_wbio(octx->ssl, bio);
#else
  SSL_set_bio(octx->ssl, bio, bio);
#endif

#ifdef HAS_ALPN
  if(connssl->alpn) {
    Curl_alpn_to_proto_str(&proto, connssl->alpn);
    infof(data, VTLS_INFOF_ALPN_OFFER_1STR, proto.data);
  }
#endif
  connssl->connecting_state = ssl_connect_2;
  return CURLE_OK;
}